

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# guild.cpp
# Opt level: O1

void __thiscall
Guild_Create::Guild_Create
          (Guild_Create *this,GuildManager *manager,string *tag,string *name,Character *leader)

{
  pointer pcVar1;
  string local_70;
  string local_50;
  
  (this->super_enable_shared_from_this<Guild_Create>)._M_weak_this.
  super___weak_ptr<Guild_Create,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_enable_shared_from_this<Guild_Create>)._M_weak_this.
  super___weak_ptr<Guild_Create,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->tag)._M_dataplus._M_p = (pointer)&(this->tag).field_2;
  (this->tag)._M_string_length = 0;
  (this->tag).field_2._M_local_buf[0] = '\0';
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  (this->name)._M_string_length = 0;
  (this->name).field_2._M_local_buf[0] = '\0';
  (this->members).
  super__Vector_base<std::shared_ptr<Guild_Member>,_std::allocator<std::shared_ptr<Guild_Member>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->members).
  super__Vector_base<std::shared_ptr<Guild_Member>,_std::allocator<std::shared_ptr<Guild_Member>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->members).
  super__Vector_base<std::shared_ptr<Guild_Member>,_std::allocator<std::shared_ptr<Guild_Member>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  util::uppercase(&local_50,tag);
  std::__cxx11::string::operator=((string *)tag,(string *)&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  this->manager = manager;
  std::__cxx11::string::_M_assign((string *)&this->tag);
  std::__cxx11::string::_M_assign((string *)&this->name);
  this->leader = leader;
  pcVar1 = (leader->real_name)._M_dataplus._M_p;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar1,pcVar1 + (leader->real_name)._M_string_length);
  AddMember(this,&local_70,0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

Guild_Create::Guild_Create(GuildManager *manager, std::string tag, std::string name, Character *leader)
{
	tag = util::uppercase(tag);

	this->manager = manager;
	this->tag = tag;
	this->name = name;
	this->leader = leader;

	this->AddMember(leader->real_name, 0);
}